

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<bool>::resize_internal(QList<bool> *this,qsizetype newSize)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 != (Data *)0x0) &&
      ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) &&
     (newSize <=
      (long)((((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar1->super_QArrayData).alloc) - (long)(this->d).ptr))) {
    if (newSize < (this->d).size) {
      (this->d).size = newSize;
    }
    return;
  }
  QArrayDataPointer<bool>::detachAndGrow
            (&this->d,GrowsAtEnd,newSize - (this->d).size,(bool **)0x0,
             (QArrayDataPointer<bool> *)0x0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}